

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O2

vrna_param_t * vrna_params(vrna_md_t *md)

{
  char *__dest;
  int (*paiVar1) [5];
  vrna_param_t *pvVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  int (*paiVar6) [8];
  int (*paaiVar7) [5] [5];
  int (*paiVar8) [5];
  int (*paaaiVar9) [8] [5] [5];
  vrna_param_t *pvVar10;
  vrna_md_t *pvVar11;
  int (*paiVar12) [8];
  int (*paaiVar13) [5] [5];
  int (*paiVar14) [5];
  int (*paaaiVar15) [8] [5] [5];
  vrna_md_t *pvVar16;
  int (*paiVar17) [8];
  int (*paaiVar18) [5] [5];
  int (*paiVar19) [5];
  int (*paaaiVar20) [8] [5] [5];
  uint uVar21;
  int *piVar22;
  int (*paiVar23) [5];
  vrna_param_t *pvVar24;
  int (*paaaiVar25) [8] [5] [5];
  ulong uVar26;
  vrna_md_t *pvVar27;
  int (*paiVar28) [5];
  int (*paiVar29) [5];
  long lVar30;
  int (*paiVar31) [5];
  int (*paiVar32) [5];
  long lVar33;
  int (*paiVar34) [5];
  int (*paiVar35) [5];
  int (*paaaiVar36) [8] [5] [5];
  int (*paiVar37) [5];
  int (*paiVar38) [5];
  int (*paiVar39) [5];
  int (*paiVar40) [5];
  vrna_md_t *pvVar41;
  int (*paiVar42) [5];
  int (*paiVar43) [5];
  int (*paiVar44) [5];
  int (*paiVar45) [5];
  int (*paiVar46) [5];
  long lVar47;
  long lVar48;
  int (*paiVar49) [5];
  int (*paiVar50) [5];
  double dVar51;
  int iVar52;
  double dVar53;
  double dVar54;
  vrna_md_t md_1;
  int aiStack_e0 [4];
  vrna_param_t *pvStack_d0;
  int (*paiStack_c8) [5];
  int (*paiStack_c0) [5];
  vrna_md_t *pvStack_b8;
  long lStack_b0;
  int (*paiStack_a8) [5];
  int (*paiStack_a0) [5];
  vrna_md_t *pvStack_98;
  vrna_param_t *pvStack_90;
  double dStack_88;
  int aiStack_80 [2];
  int (*paiStack_78) [5];
  int (*paiStack_70) [5];
  int (*paiStack_68) [5];
  int (*paiStack_60) [5];
  int (*paiStack_58) [5];
  int (*paiStack_50) [5];
  int (*paiStack_48) [5];
  int (*paiStack_40) [5];
  int (*paiStack_38) [5];
  
  if (md == (vrna_md_t *)0x0) {
    vrna_md_set_default((vrna_md_t *)&stack0xfffffffffffff810);
    pvVar2 = get_scaled_params((vrna_md_t *)&stack0xfffffffffffff810);
    return pvVar2;
  }
  aiStack_e0[0] = 0x11aa23;
  aiStack_e0[1] = 0;
  pvStack_b8 = md;
  pvStack_d0 = (vrna_param_t *)vrna_alloc(0x33ea8);
  __dest = pvStack_d0->param_file;
  aiStack_e0[0] = 0x11aa3e;
  aiStack_e0[1] = 0;
  memset(__dest,0,0x100);
  aiStack_e0[0] = 0x11aa43;
  aiStack_e0[1] = 0;
  pcVar3 = last_parameter_file();
  if (pcVar3 != (char *)0x0) {
    aiStack_e0[0] = 0x11aa4d;
    aiStack_e0[1] = 0;
    pcVar3 = last_parameter_file();
    aiStack_e0[0] = 0x11aa5d;
    aiStack_e0[1] = 0;
    strncpy(__dest,pcVar3,0xff);
  }
  pvVar11 = pvStack_b8;
  pvVar2 = pvStack_d0;
  aiStack_e0[0] = 0x11aa7b;
  aiStack_e0[1] = 0;
  memcpy(&pvStack_d0->model_details,pvStack_b8,0x7e8);
  dVar54 = *(double *)(*(int (*) [5] [5] [5] [5])&pvVar11->temperature)[0][0][0];
  pvVar2->temperature = dVar54;
  dVar54 = (dVar54 + 273.15) / Tmeasure;
  pvVar2->ninio[2] = (int)((double)niniodH - (double)(niniodH - ninio37) * dVar54);
  pvVar2->lxc = lxc37 * dVar54;
  dVar53 = (double)MultipleCAdH;
  iVar52 = MultipleCAdH - MultipleCA37;
  pvVar2->TripleC = (int)((double)TripleCdH - (double)(TripleCdH - TripleC37) * dVar54);
  pvVar2->MultipleCA = (int)(dVar53 - (double)iVar52 * dVar54);
  pvVar2->MultipleCB = (int)((double)MultipleCBdH - (double)(MultipleCBdH - MultipleCB37) * dVar54);
  dVar53 = (double)DuplexInitdH;
  iVar52 = DuplexInitdH - DuplexInit37;
  pvVar2->TerminalAU = (int)((double)TerminalAUdH - (double)(TerminalAUdH - TerminalAU37) * dVar54);
  pvVar2->DuplexInit = (int)(dVar53 - (double)iVar52 * dVar54);
  pvVar2->MLbase = (int)((double)ML_BASEdH - (double)(ML_BASEdH - ML_BASE37) * dVar54);
  pvVar2->PS_penalty = -0x8a;
  pvVar2->PSM_penalty = 0x3ef;
  pvVar2->PSP_penalty = 0x5dc;
  pvVar2->PB_penalty = 0xf6;
  pvVar2->PUP_penalty = 6;
  pvVar2->PPS_penalty = 0x60;
  pvVar2->e_stP_penalty = 0.89;
  pvVar2->e_intP_penalty = 0.74;
  pvVar2->ap_penalty = 0x155;
  pvVar2->bp_penalty = 0x38;
  pvVar2->cp_penalty = 0xc;
  pvVar2->a_penalty = 0x153;
  pvVar2->b_penalty = 3;
  pvVar2->c_penalty = 2;
  pvVar2->MLclosing = (int)((double)ML_closingdH - (double)(ML_closingdH - ML_closing37) * dVar54);
  pvVar2->gquadLayerMismatch =
       (int)((double)GQuadLayerMismatchH -
            (double)(GQuadLayerMismatchH - GQuadLayerMismatch37) * dVar54);
  pvVar2->gquadLayerMismatchMax = GQuadLayerMismatchMax;
  piVar22 = pvVar2->gquad[2] + 3;
  aiStack_80[0] = 0;
  aiStack_80[1] = 0;
  paiVar8 = (int (*) [5])0x2;
  dStack_88 = dVar54;
  while (paiVar8 != (int (*) [5])0x8) {
    uVar26 = 0;
    paiStack_c0 = paiVar8;
    while (uVar26 != 0x2b) {
      dVar53 = (double)GQuadAlphadH;
      iVar52 = GQuadAlphadH - GQuadAlpha37;
      paiStack_c8 = (int (*) [5])
                    ((double)GQuadBetadH - (double)(GQuadBetadH - GQuadBeta37) * dVar54);
      aiStack_e0[0] = 0x11ad29;
      aiStack_e0[1] = 0;
      dVar51 = log((double)(uVar26 + 1 & 0xffffffff));
      piVar22[uVar26] =
           (int)(dVar51 * (double)paiStack_c8) +
           (int)(dVar53 - (double)iVar52 * dVar54) * ((int)paiVar8 + -1);
      uVar26 = uVar26 + 1;
      dVar54 = dStack_88;
    }
    piVar22 = piVar22 + 0x2e;
    paiVar8 = (int (*) [5])((long)*paiStack_c0 + 1);
  }
  for (lVar4 = 0; lVar4 != 0x1f; lVar4 = lVar4 + 1) {
    pvStack_d0->hairpin[lVar4] =
         (int)((double)hairpindH[lVar4] - (double)(hairpindH[lVar4] - hairpin37[lVar4]) * dVar54);
  }
  for (lVar4 = 0; lVar4 != 0x7c; lVar4 = lVar4 + 4) {
    *(int *)((long)pvStack_d0->bulge + lVar4) =
         (int)((double)*(int *)((long)bulgedH + lVar4) -
              (double)(*(int *)((long)bulgedH + lVar4) - *(int *)((long)bulge37 + lVar4)) * dVar54);
    *(int *)((long)pvStack_d0->internal_loop + lVar4) =
         (int)((double)*(int *)((long)internal_loopdH + lVar4) -
              (double)(*(int *)((long)internal_loopdH + lVar4) -
                      *(int *)((long)internal_loop37 + lVar4)) * dVar54);
  }
  uVar21 = 0;
  uVar26 = 0;
  while( true ) {
    aiStack_e0[0] = 0x11ae3a;
    aiStack_e0[1] = 0;
    sVar5 = strlen(Tetraloops);
    if (sVar5 <= uVar21) break;
    pvStack_d0->Tetraloop_E[uVar26] =
         (int)((double)TetraloopdH[uVar26] -
              (double)(TetraloopdH[uVar26] - Tetraloop37[uVar26]) * dStack_88);
    uVar26 = (ulong)((int)uVar26 + 1);
    uVar21 = uVar21 + 7;
  }
  uVar21 = 0;
  uVar26 = 0;
  while( true ) {
    aiStack_e0[0] = 0x11ae97;
    aiStack_e0[1] = 0;
    sVar5 = strlen(Triloops);
    if (sVar5 <= uVar21) break;
    pvStack_d0->Triloop_E[uVar26] =
         (int)((double)TriloopdH[uVar26] -
              (double)(TriloopdH[uVar26] - Triloop37[uVar26]) * dStack_88);
    uVar26 = (ulong)((int)uVar26 + 1);
    uVar21 = uVar21 + 5;
  }
  uVar21 = 0;
  uVar26 = 0;
  while( true ) {
    aiStack_e0[0] = 0x11aef4;
    aiStack_e0[1] = 0;
    sVar5 = strlen(Hexaloops);
    pvVar2 = pvStack_d0;
    if (sVar5 <= uVar21) break;
    pvStack_d0->Hexaloop_E[uVar26] =
         (int)((double)HexaloopdH[uVar26] -
              (double)(HexaloopdH[uVar26] - Hexaloop37[uVar26]) * dStack_88);
    uVar26 = (ulong)((int)uVar26 + 1);
    uVar21 = uVar21 + 9;
  }
  for (lVar4 = 0xc767; lVar4 != 0xc76f; lVar4 = lVar4 + 1) {
    *(int *)((long)(pvStack_d0->stack + -1) + 0x1c + lVar4 * 4) =
         (int)((double)ML_interndH - (double)(ML_interndH - ML_intern37) * dStack_88);
  }
  paiVar6 = pvStack_d0->stack;
  paiVar12 = stackdH;
  paiVar17 = stack37;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    for (lVar30 = 0; lVar30 != 8; lVar30 = lVar30 + 1) {
      (*paiVar6)[lVar30] =
           (int)((double)(*paiVar12)[lVar30] -
                (double)((*paiVar12)[lVar30] - (*paiVar17)[lVar30]) * dStack_88);
    }
    paiVar12 = paiVar12 + 1;
    paiVar17 = paiVar17 + 1;
    paiVar6 = paiVar6 + 1;
  }
  paaiVar7 = mismatchIdH;
  paaiVar13 = mismatchI37;
  paaiVar18 = mismatchHdH;
  pvStack_90 = pvStack_d0;
  paiVar8 = mismatchExt37[0];
  paiVar14 = mismatchH37[0];
  paiVar19 = mismatch1nIdH[0];
  paiVar29 = mismatch1nI37[0];
  paiVar32 = mismatch23IdH[0];
  paiVar35 = mismatch23I37[0];
  paiVar38 = mismatchMdH[0];
  paiVar40 = mismatchExtdH[0];
  lVar4 = 0;
  paiVar43 = mismatchM37[0];
  while (paiVar49 = paiVar43, lVar30 = lVar4, paiVar44 = paiVar40, paiVar42 = paiVar38,
        paiVar39 = paiVar35, paiVar37 = paiVar32, paiVar34 = paiVar29, paiVar31 = paiVar19,
        paiVar28 = paiVar14, paiVar23 = paiVar8, lVar30 != 8) {
    paiVar8 = *paaiVar7;
    paiVar14 = *paaiVar13;
    paiVar19 = *paaiVar18;
    pvVar24 = pvStack_90;
    paiVar29 = paiVar28;
    paiVar32 = paiVar31;
    paiVar35 = paiVar34;
    paiVar38 = paiVar37;
    paiVar40 = paiVar39;
    paiVar43 = paiVar42;
    paiVar45 = paiVar44;
    paiVar1 = (int (*) [5])0x0;
    paiVar50 = paiVar49;
    paiStack_c8 = paiVar23;
    while (paiVar46 = paiVar1, paiVar46 != (int (*) [5])0x5) {
      for (lVar4 = 0; lVar4 != 0x14; lVar4 = lVar4 + 4) {
        iVar52 = *(int *)((long)*(int (*) [5])*paiVar8 + lVar4);
        *(int *)((long)pvVar24->mismatchI[0][0] + lVar4) =
             (int)((double)iVar52 -
                  (double)(iVar52 - *(int *)((long)*(int (*) [5])*paiVar14 + lVar4)) * dStack_88);
        iVar52 = *(int *)((long)*(int (*) [5])*paiVar19 + lVar4);
        *(int *)((long)pvVar24->mismatchH[0][0] + lVar4) =
             (int)((double)iVar52 -
                  (double)(iVar52 - *(int *)((long)*(int (*) [5])*paiVar29 + lVar4)) * dStack_88);
        iVar52 = *(int *)((long)*(int (*) [5])*paiVar32 + lVar4);
        *(int *)((long)pvVar24->mismatch1nI[0][0] + lVar4) =
             (int)((double)iVar52 -
                  (double)(iVar52 - *(int *)((long)*(int (*) [5])*paiVar35 + lVar4)) * dStack_88);
        iVar52 = *(int *)((long)*(int (*) [5])*paiVar38 + lVar4);
        *(int *)((long)pvVar24->mismatch23I[0][0] + lVar4) =
             (int)((double)iVar52 -
                  (double)(iVar52 - *(int *)((long)*(int (*) [5])*paiVar40 + lVar4)) * dStack_88);
        if ((*(int (*) [5])&pvStack_b8->dangles)[0] == 0) {
          *(undefined4 *)((long)pvVar24->mismatchExt[0][0] + lVar4) = 0;
          uVar21 = 0;
          lVar47 = 0x1218;
        }
        else {
          iVar52 = *(int *)((long)*(int (*) [5])*paiVar43 + lVar4);
          uVar21 = (uint)((double)iVar52 -
                         (double)(iVar52 - *(int *)((long)*(int (*) [5])*paiVar50 + lVar4)) *
                         dStack_88);
          *(uint *)((long)pvVar24->mismatchM[0][0] + lVar4) = (int)uVar21 >> 0x1f & uVar21;
          iVar52 = *(int *)((long)*(int (*) [5])*paiVar45 + lVar4);
          uVar21 = (uint)((double)iVar52 -
                         (double)(iVar52 - *(int *)((long)*paiStack_c8 + lVar4)) * dStack_88);
          uVar21 = (int)uVar21 >> 0x1f & uVar21;
          lVar47 = 0x278;
        }
        *(uint *)((long)(pvVar24->stack + -1) + 0x1c + lVar4 + lVar47) = uVar21;
      }
      pvVar24 = (vrna_param_t *)(pvVar24->stack[0] + 4);
      paiVar8 = paiVar8 + 1;
      paiVar14 = paiVar14 + 1;
      paiVar19 = paiVar19 + 1;
      paiVar29 = paiVar29 + 1;
      paiVar32 = paiVar32 + 1;
      paiVar35 = paiVar35 + 1;
      paiVar38 = paiVar38 + 1;
      paiVar40 = paiVar40 + 1;
      paiVar43 = paiVar43 + 1;
      paiVar50 = paiVar50 + 1;
      paiVar45 = paiVar45 + 1;
      paiStack_c8 = (int (*) [5])(*paiStack_c8 + 5);
      paiStack_c0 = paiVar46;
      paiVar1 = (int (*) [5])((long)*paiVar46 + 1);
    }
    pvStack_90 = (vrna_param_t *)(pvStack_90->stack + 3);
    paaiVar7 = (int (*) [5] [5])((long)paaiVar7 + 100);
    paaiVar13 = (int (*) [5] [5])((long)paaiVar13 + 100);
    paaiVar18 = (int (*) [5] [5])((long)paaiVar18 + 100);
    paiVar8 = (int (*) [5])(*paiVar23 + 0x19);
    paiVar14 = paiVar28 + 5;
    paiVar19 = paiVar31 + 5;
    paiVar29 = paiVar34 + 5;
    paiVar32 = paiVar37 + 5;
    paiVar35 = paiVar39 + 5;
    paiVar38 = paiVar42 + 5;
    paiVar40 = paiVar44 + 5;
    paiVar43 = paiVar49 + 5;
    lStack_b0 = lVar30;
    paiStack_78 = paiVar23;
    paiStack_70 = paiVar44;
    paiStack_68 = paiVar49;
    paiStack_60 = paiVar42;
    paiStack_58 = paiVar39;
    paiStack_50 = paiVar37;
    paiStack_48 = paiVar34;
    paiStack_40 = paiVar31;
    paiStack_38 = paiVar28;
    lVar4 = lVar30 + 1;
  }
  paiVar8 = pvStack_d0->dangle5;
  paiVar14 = dangle5_dH;
  paiVar19 = dangle5_37;
  paiVar29 = dangle3_dH;
  paiVar32 = dangle3_37;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    for (lVar30 = 0; lVar30 != 0x14; lVar30 = lVar30 + 4) {
      iVar52 = *(int *)((long)*paiVar14 + lVar30);
      uVar21 = (uint)((double)iVar52 -
                     (double)(iVar52 - *(int *)((long)*paiVar19 + lVar30)) * dStack_88);
      *(uint *)((long)*paiVar8 + lVar30) = (int)uVar21 >> 0x1f & uVar21;
      iVar52 = *(int *)((long)*paiVar29 + lVar30);
      uVar21 = (uint)((double)iVar52 -
                     (double)(iVar52 - *(int *)((long)*paiVar32 + lVar30)) * dStack_88);
      *(uint *)((long)paiVar8[8] + lVar30) = (int)uVar21 >> 0x1f & uVar21;
    }
    paiVar14 = paiVar14 + 1;
    paiVar19 = paiVar19 + 1;
    paiVar8 = paiVar8 + 1;
    paiVar29 = paiVar29 + 1;
    paiVar32 = paiVar32 + 1;
  }
  paaaiVar9 = pvStack_d0->int11;
  paaaiVar15 = int11_dH;
  paaaiVar20 = int11_37;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    paaaiVar36 = paaaiVar9;
    paiVar8 = (int (*) [5])paaaiVar20;
    paiVar14 = (int (*) [5])paaaiVar15;
    for (lVar30 = 0; lVar30 != 8; lVar30 = lVar30 + 1) {
      paaaiVar25 = paaaiVar36;
      paiVar29 = paiVar8;
      paiVar19 = paiVar14;
      for (lVar47 = 0; lVar47 != 5; lVar47 = lVar47 + 1) {
        for (lVar48 = 0; lVar48 != 5; lVar48 = lVar48 + 1) {
          iVar52 = (*(int (*) [5] [5])*paiVar19)[0][lVar48];
          (*paaaiVar25)[0][0][lVar48] =
               (int)((double)iVar52 -
                    (double)(iVar52 - (*(int (*) [5] [5])*paiVar29)[0][lVar48]) * dStack_88);
        }
        paiVar19 = paiVar19 + 1;
        paiVar29 = paiVar29 + 1;
        paaaiVar25 = (int (*) [8] [5] [5])((*paaaiVar25)[0] + 1);
      }
      paiVar14 = paiVar14 + 5;
      paiVar8 = paiVar8 + 5;
      paaaiVar36 = (int (*) [8] [5] [5])(*paaaiVar36 + 1);
    }
    paaaiVar15 = (int (*) [8] [5] [5])((long)paaaiVar15 + 800);
    paaaiVar20 = (int (*) [8] [5] [5])((long)paaaiVar20 + 800);
    paaaiVar9 = paaaiVar9 + 1;
  }
  lVar4 = 0;
  paiVar8 = (int (*) [5])int21_dH;
  paiVar14 = (int (*) [5])int21_37;
  pvVar11 = (vrna_md_t *)pvStack_d0->int21;
  while (pvVar16 = pvVar11, paiVar29 = paiVar14, paiVar19 = paiVar8, lVar30 = lVar4, lVar30 != 8) {
    paiVar8 = paiVar19;
    paiVar14 = paiVar29;
    pvVar11 = pvVar16;
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      paiVar32 = paiVar14;
      paiVar35 = paiVar8;
      pvVar41 = pvVar11;
      for (lVar47 = 0; lVar47 != 5; lVar47 = lVar47 + 1) {
        pvVar27 = pvVar41;
        paiVar38 = paiVar35;
        paiVar40 = paiVar32;
        for (lVar48 = 0; lVar48 != 5; lVar48 = lVar48 + 1) {
          for (lVar33 = 0; lVar33 != 5; lVar33 = lVar33 + 1) {
            iVar52 = (*(int (*) [5] [5] [5])*paiVar38)[0][0][lVar33];
            *(int *)((long)pvVar27->nonstandards + (lVar33 + -0x12) * 4) =
                 (int)((double)iVar52 -
                      (double)(iVar52 - (*(int (*) [5] [5] [5])*paiVar40)[0][0][lVar33]) * dStack_88
                      );
          }
          paiVar38 = paiVar38 + 1;
          paiVar40 = paiVar40 + 1;
          pvVar27 = (vrna_md_t *)&pvVar27->dangles;
        }
        paiVar35 = (int (*) [5])(*paiVar35 + 0x19);
        paiVar32 = (int (*) [5])(*paiVar32 + 0x19);
        pvVar41 = (vrna_md_t *)((long)pvVar41->nonstandards + 0x1c);
      }
      paiVar8 = paiVar8 + 0x19;
      paiVar14 = paiVar14 + 0x19;
      pvVar11 = (vrna_md_t *)(pvVar11->pair[2] + 0x12);
    }
    paiVar8 = paiVar19 + 200;
    paiVar14 = paiVar29 + 200;
    pvVar11 = (vrna_md_t *)(pvVar16[1].pair[0x14] + 9);
    paiStack_c8 = paiVar19;
    paiStack_c0 = paiVar29;
    pvStack_b8 = pvVar16;
    lStack_b0 = lVar30;
    lVar4 = lVar30 + 1;
  }
  pvStack_98 = (vrna_md_t *)pvStack_d0->int22;
  paiStack_a0 = (int (*) [5])int22_dH;
  paiStack_a8 = (int (*) [5])int22_37;
  pvVar24 = (vrna_param_t *)0x0;
  while (pvVar10 = pvVar24, pvVar10 != (vrna_param_t *)0x8) {
    pvVar11 = pvStack_98;
    paiVar8 = paiStack_a8;
    paiVar14 = paiStack_a0;
    lVar4 = 0;
    while (lVar30 = lVar4, paiVar29 = paiVar14, paiVar19 = paiVar8, pvVar16 = pvVar11, lVar30 != 8)
    {
      pvVar11 = pvVar16;
      paiVar8 = paiVar29;
      paiVar14 = paiVar19;
      for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
        paiVar32 = paiVar8;
        pvVar41 = pvVar11;
        paiVar35 = paiVar14;
        for (lVar47 = 0; lVar47 != 5; lVar47 = lVar47 + 1) {
          paiVar38 = paiVar35;
          paiVar40 = paiVar32;
          pvVar27 = pvVar41;
          for (lVar48 = 0; lVar48 != 5; lVar48 = lVar48 + 1) {
            for (lVar33 = 0; lVar33 != 5; lVar33 = lVar33 + 1) {
              *(int *)((long)pvVar27->nonstandards + (lVar33 + -0x12) * 4) =
                   (int)((double)(*paiVar40)[lVar33] -
                        (double)((*paiVar40)[lVar33] - (*paiVar38)[lVar33]) * dStack_88);
            }
            paiVar40 = (int (*) [5])(*paiVar40 + 5);
            paiVar38 = (int (*) [5])(*paiVar38 + 5);
            pvVar27 = (vrna_md_t *)&pvVar27->dangles;
          }
          paiVar32 = (int (*) [5])(*paiVar32 + 0x19);
          paiVar35 = (int (*) [5])(*paiVar35 + 0x19);
          pvVar41 = (vrna_md_t *)((long)pvVar41->nonstandards + 0x1c);
        }
        paiVar8 = paiVar8 + 0x19;
        paiVar14 = paiVar14 + 0x19;
        pvVar11 = (vrna_md_t *)(pvVar11->pair[2] + 0x12);
      }
      pvVar11 = (vrna_md_t *)(pvVar16[1].pair[2] + 0xc);
      paiVar8 = paiVar19 + 0x7d;
      paiVar14 = paiVar29 + 0x7d;
      paiStack_c8 = paiVar19;
      paiStack_c0 = paiVar29;
      pvStack_b8 = pvVar16;
      lStack_b0 = lVar30;
      lVar4 = lVar30 + 1;
    }
    paiStack_a0 = paiStack_a0 + 1000;
    paiStack_a8 = paiStack_a8 + 1000;
    pvStack_98 = (vrna_md_t *)(pvStack_98[9].pair[0x12] + 3);
    pvStack_90 = pvVar10;
    pvVar24 = (vrna_param_t *)((long)&pvVar10->id + 1);
  }
  aiStack_e0[0] = 0x11b68d;
  aiStack_e0[1] = 0;
  strncpy(pvStack_d0->Tetraloops,Tetraloops,0x119);
  aiStack_e0[0] = 0x11b6a5;
  aiStack_e0[1] = 0;
  strncpy(pvVar2->Triloops,Triloops,0xf1);
  aiStack_e0[0] = 0x11b6c0;
  aiStack_e0[1] = 0;
  strncpy(pvVar2->Hexaloops,Hexaloops,0x169);
  id = id + 1;
  pvVar2->id = id;
  return pvVar2;
}

Assistant:

PUBLIC vrna_param_t *
vrna_params(vrna_md_t *md)
{
  if (md) {
    return get_scaled_params(md);
  } else {
    vrna_md_t md;
    vrna_md_set_default(&md);
    return get_scaled_params(&md);
  }
}